

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

int __thiscall CRegexParser::parse_int(CRegexParser *this,utf8_ptr *p,size_t *chrem)

{
  wchar_t wVar1;
  size_t sVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((*chrem != 0) && (wVar1 = utf8_ptr::getch(p), 0xfffffff5 < (uint)(wVar1 + L'\xffffffc6'))) {
    sVar2 = *chrem;
    iVar3 = 0;
    while (sVar2 != 0) {
      wVar1 = utf8_ptr::getch(p);
      if ((uint)(wVar1 + L'\xffffffc6') < 0xfffffff6) {
        return iVar3;
      }
      wVar1 = utf8_ptr::getch(p);
      iVar3 = iVar3 * 10 + wVar1 + -0x30;
      utf8_ptr::inc(p);
      sVar2 = *chrem - 1;
      *chrem = sVar2;
    }
  }
  return iVar3;
}

Assistant:

int CRegexParser::parse_int(utf8_ptr *p, size_t *chrem)
{
    /* if it's not a number to start with, simply return -1 */
    if (*chrem == 0 || !is_digit(p->getch()))
        return -1;
    
    /* keep going as long as we find digits */
    int acc;
    for (acc = 0 ; *chrem > 0 && is_digit(p->getch()) ; p->inc(), --*chrem)
    {
        /* add this digit into the accumulator */
        acc *= 10;
        acc += value_of_digit(p->getch());
    }

    /* return the accumulated result */
    return acc;
}